

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O3

void TestBufferStreamEof(void)

{
  entry_value_collector local_41;
  begin local_40;
  lazy_ostream local_28;
  undefined8 *local_18;
  char *local_10;
  
  local_40.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_40.m_file_name.m_end = "";
  local_40.m_line_num = 0x1cb;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_41.m_last = true;
  local_28.m_empty = false;
  local_28._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dc970;
  local_18 = &boost::unit_test::lazy_ostream::inst;
  local_10 = "TestBufferStreamEof";
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_28);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector(&local_41);
  TestEof<int>();
  TestEof<long>();
  TestEof<float>();
  TestEof<double>();
  return;
}

Assistant:

void TestBufferStreamEof()
{
    BOOST_TEST_MESSAGE( "TestBufferStreamEof");

    TestEof<int32_t>();

    TestEof<int64_t>();

    TestEof<float>();

    TestEof<double>();
}